

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_negation.c
# Opt level: O0

int run_container_negation_range_inplace
              (run_container_t *src,int range_start,int range_end,container_t **dst)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  container_t *pcVar4;
  long *in_RCX;
  int in_EDX;
  int in_ESI;
  run_container_t *in_RDI;
  rle16_t next;
  rle16_t buffered;
  int k;
  int my_nbr_runs;
  run_container_t *ans;
  int ans_1;
  _Bool first_val_past_range;
  _Bool last_val_in_range;
  _Bool first_val_in_range;
  _Bool last_val_before_range;
  uint8_t return_typecode;
  uint16_t in_stack_ffffffffffffffb6;
  undefined4 in_stack_ffffffffffffffb8;
  rle16_t rVar5;
  uint16_t in_stack_ffffffffffffffbc;
  uint16_t in_stack_ffffffffffffffbe;
  int in_stack_ffffffffffffffc0;
  int iVar6;
  int in_stack_ffffffffffffffc4;
  run_container_t *in_stack_ffffffffffffffc8;
  _Bool local_25;
  _Bool local_22;
  byte local_21;
  run_container_t *typecode_after;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar7;
  
  if (in_ESI < in_EDX) {
    if (in_RDI->capacity == in_RDI->n_runs) {
      local_22 = false;
      local_25 = false;
      if (0 < in_ESI) {
        local_22 = run_container_contains
                             ((run_container_t *)
                              CONCAT26(in_stack_ffffffffffffffbe,
                                       CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                                      ),in_stack_ffffffffffffffb6);
      }
      _Var2 = run_container_contains
                        ((run_container_t *)
                         CONCAT26(in_stack_ffffffffffffffbe,
                                  CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
                         in_stack_ffffffffffffffb6);
      if (local_22 == _Var2) {
        _Var2 = run_container_contains
                          ((run_container_t *)
                           CONCAT26(in_stack_ffffffffffffffbe,
                                    CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
                           in_stack_ffffffffffffffb6);
        if (in_EDX != 0x10000) {
          local_25 = run_container_contains
                               ((run_container_t *)
                                CONCAT26(in_stack_ffffffffffffffbe,
                                         CONCAT24(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8)),
                                in_stack_ffffffffffffffb6);
        }
        if (_Var2 == local_25) {
          iVar3 = run_container_negation_range
                            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                             in_stack_ffffffffffffffc0,
                             (container_t **)
                             CONCAT26(in_stack_ffffffffffffffbe,
                                      CONCAT24(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
                            );
          run_container_free((run_container_t *)0x166e8d);
          return iVar3;
        }
      }
    }
    iVar3 = in_RDI->n_runs;
    in_RDI->n_runs = 0;
    iVar6 = 0;
    while( true ) {
      bVar1 = false;
      if (iVar6 < iVar3) {
        bVar1 = (int)(uint)in_RDI->runs[iVar6].value < in_ESI;
      }
      if (!bVar1) break;
      in_RDI->n_runs = in_RDI->n_runs + 1;
      iVar6 = iVar6 + 1;
    }
    typecode_after = in_RDI;
    memset(&stack0xffffffffffffffbc,0,4);
    rVar5.length = in_stack_ffffffffffffffbe;
    rVar5.value = in_stack_ffffffffffffffbc;
    if (iVar6 < iVar3) {
      in_stack_ffffffffffffffbc = typecode_after->runs[iVar6].value;
      in_stack_ffffffffffffffbe = typecode_after->runs[iVar6].length;
    }
    run_container_smart_append_exclusive
              (in_RDI,(uint16_t)in_ESI,((short)in_EDX - (uint16_t)in_ESI) - 1);
    for (; iVar6 < iVar3; iVar6 = iVar6 + 1) {
      if (iVar6 + 1 < iVar3) {
        rVar5 = typecode_after->runs[iVar6 + 1];
      }
      run_container_smart_append_exclusive
                (in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffbe);
      in_stack_ffffffffffffffbc = rVar5.value;
      in_stack_ffffffffffffffbe = rVar5.length;
    }
    pcVar4 = convert_run_to_efficient_container
                       ((run_container_t *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        (uint8_t *)typecode_after);
    *in_RCX = (long)pcVar4;
    if (local_21 != 3) {
      run_container_free((run_container_t *)0x166ffb);
    }
    uVar7 = (uint)local_21;
  }
  else {
    *in_RCX = (long)in_RDI;
    uVar7 = 3;
  }
  return uVar7;
}

Assistant:

int run_container_negation_range_inplace(run_container_t *src,
                                         const int range_start,
                                         const int range_end,
                                         container_t **dst) {
    uint8_t return_typecode;

    if (range_end <= range_start) {
        *dst = src;
        return RUN_CONTAINER_TYPE;
    }

    // TODO: efficient special case when range is 0 to 65535 inclusive

    if (src->capacity == src->n_runs) {
        // no excess room.  More checking to see if result can fit
        bool last_val_before_range = false;
        bool first_val_in_range = false;
        bool last_val_in_range = false;
        bool first_val_past_range = false;

        if (range_start > 0)
            last_val_before_range =
                run_container_contains(src, (uint16_t)(range_start - 1));
        first_val_in_range = run_container_contains(src, (uint16_t)range_start);

        if (last_val_before_range == first_val_in_range) {
            last_val_in_range =
                run_container_contains(src, (uint16_t)(range_end - 1));
            if (range_end != 0x10000)
                first_val_past_range =
                    run_container_contains(src, (uint16_t)range_end);

            if (last_val_in_range ==
                first_val_past_range) {  // no space for inplace
                int ans = run_container_negation_range(src, range_start,
                                                       range_end, dst);
                run_container_free(src);
                return ans;
            }
        }
    }
    // all other cases: result will fit

    run_container_t *ans = src;
    int my_nbr_runs = src->n_runs;

    ans->n_runs = 0;
    int k = 0;
    for (; (k < my_nbr_runs) && (src->runs[k].value < range_start); ++k) {
        // ans->runs[k] = src->runs[k]; (would be self-copy)
        ans->n_runs++;
    }

    // as with Java implementation, use locals to give self a buffer of depth 1
    rle16_t buffered = CROARING_MAKE_RLE16(0, 0);
    rle16_t next = buffered;
    if (k < my_nbr_runs) buffered = src->runs[k];

    run_container_smart_append_exclusive(
        ans, (uint16_t)range_start, (uint16_t)(range_end - range_start - 1));

    for (; k < my_nbr_runs; ++k) {
        if (k + 1 < my_nbr_runs) next = src->runs[k + 1];

        run_container_smart_append_exclusive(ans, buffered.value,
                                             buffered.length);
        buffered = next;
    }

    *dst = convert_run_to_efficient_container(ans, &return_typecode);
    if (return_typecode != RUN_CONTAINER_TYPE) run_container_free(ans);

    return return_typecode;
}